

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FirmataParser.cpp
# Opt level: O0

void __thiscall
firmata::FirmataParser::FirmataParser(FirmataParser *this,uint8_t *dataBuffer,size_t dataBufferSize)

{
  size_t dataBufferSize_local;
  uint8_t *dataBuffer_local;
  FirmataParser *this_local;
  
  this->dataBuffer = dataBuffer;
  this->dataBufferSize = dataBufferSize;
  this->executeMultiByteCommand = '\0';
  this->multiByteChannel = '\0';
  this->waitForData = 0;
  this->parsingSysex = false;
  this->sysexBytesRead = 0;
  this->currentAnalogCallbackContext = (void *)0x0;
  this->currentDigitalCallbackContext = (void *)0x0;
  this->currentReportAnalogCallbackContext = (void *)0x0;
  this->currentReportDigitalCallbackContext = (void *)0x0;
  this->currentPinModeCallbackContext = (void *)0x0;
  this->currentPinValueCallbackContext = (void *)0x0;
  this->currentReportFirmwareCallbackContext = (void *)0x0;
  this->currentReportVersionCallbackContext = (void *)0x0;
  this->currentDataBufferOverflowCallbackContext = (void *)0x0;
  this->currentStringCallbackContext = (void *)0x0;
  this->currentSysexCallbackContext = (void *)0x0;
  this->currentSystemResetCallbackContext = (void *)0x0;
  this->currentAnalogCallback = (callbackFunction)0x0;
  this->currentDigitalCallback = (callbackFunction)0x0;
  this->currentReportAnalogCallback = (callbackFunction)0x0;
  this->currentReportDigitalCallback = (callbackFunction)0x0;
  this->currentPinModeCallback = (callbackFunction)0x0;
  this->currentPinValueCallback = (callbackFunction)0x0;
  this->currentDataBufferOverflowCallback = (dataBufferOverflowCallbackFunction)0x0;
  this->currentStringCallback = (stringCallbackFunction)0x0;
  this->currentSysexCallback = (sysexCallbackFunction)0x0;
  this->currentReportFirmwareCallback = (versionCallbackFunction)0x0;
  this->currentReportVersionCallback = (systemCallbackFunction)0x0;
  this->currentSystemResetCallback = (systemCallbackFunction)0x0;
  this->allowBufferUpdate = dataBuffer == (uint8_t *)0x0;
  return;
}

Assistant:

FirmataParser::FirmataParser(uint8_t * const dataBuffer, size_t dataBufferSize)
:
  dataBuffer(dataBuffer),
  dataBufferSize(dataBufferSize),
  executeMultiByteCommand(0),
  multiByteChannel(0),
  waitForData(0),
  parsingSysex(false),
  sysexBytesRead(0),
  currentAnalogCallbackContext((void *)NULL),
  currentDigitalCallbackContext((void *)NULL),
  currentReportAnalogCallbackContext((void *)NULL),
  currentReportDigitalCallbackContext((void *)NULL),
  currentPinModeCallbackContext((void *)NULL),
  currentPinValueCallbackContext((void *)NULL),
  currentReportFirmwareCallbackContext((void *)NULL),
  currentReportVersionCallbackContext((void *)NULL),
  currentDataBufferOverflowCallbackContext((void *)NULL),
  currentStringCallbackContext((void *)NULL),
  currentSysexCallbackContext((void *)NULL),
  currentSystemResetCallbackContext((void *)NULL),
  currentAnalogCallback((callbackFunction)NULL),
  currentDigitalCallback((callbackFunction)NULL),
  currentReportAnalogCallback((callbackFunction)NULL),
  currentReportDigitalCallback((callbackFunction)NULL),
  currentPinModeCallback((callbackFunction)NULL),
  currentPinValueCallback((callbackFunction)NULL),
  currentDataBufferOverflowCallback((dataBufferOverflowCallbackFunction)NULL),
  currentStringCallback((stringCallbackFunction)NULL),
  currentSysexCallback((sysexCallbackFunction)NULL),
  currentReportFirmwareCallback((versionCallbackFunction)NULL),
  currentReportVersionCallback((systemCallbackFunction)NULL),
  currentSystemResetCallback((systemCallbackFunction)NULL)
{
    allowBufferUpdate = ((uint8_t *)NULL == dataBuffer);
}